

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

void apply_z(uECC_word_t *X1,uECC_word_t *Y1,uECC_word_t *Z,uECC_Curve curve)

{
  uECC_word_t local_48;
  uECC_word_t t1 [4];
  uECC_Curve curve_local;
  uECC_word_t *Z_local;
  uECC_word_t *Y1_local;
  uECC_word_t *X1_local;
  
  t1[3] = (uECC_word_t)curve;
  uECC_vli_modSquare_fast(&local_48,Z,curve);
  uECC_vli_modMult_fast(X1,X1,&local_48,(uECC_Curve)t1[3]);
  uECC_vli_modMult_fast(&local_48,&local_48,Z,(uECC_Curve)t1[3]);
  uECC_vli_modMult_fast(Y1,Y1,&local_48,(uECC_Curve)t1[3]);
  return;
}

Assistant:

static void apply_z(uECC_word_t * X1,
                    uECC_word_t * Y1,
                    const uECC_word_t * const Z,
                    uECC_Curve curve) {
    uECC_word_t t1[uECC_MAX_WORDS];

    uECC_vli_modSquare_fast(t1, Z, curve);    /* z^2 */
    uECC_vli_modMult_fast(X1, X1, t1, curve); /* x1 * z^2 */
    uECC_vli_modMult_fast(t1, t1, Z, curve);  /* z^3 */
    uECC_vli_modMult_fast(Y1, Y1, t1, curve); /* y1 * z^3 */
}